

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetactivation.cpp
# Opt level: O0

int __thiscall
ncnn::DarknetActivation::forward_inplace(DarknetActivation *this,Mat *bottom_top_blob,Option *opt)

{
  long in_RDI;
  Option *in_stack_00000038;
  Mat *in_stack_00000040;
  Option *in_stack_00000058;
  Mat *in_stack_00000060;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0xb8) == 3) {
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0xb8) == 2) {
    local_4 = activate_op_inplace<ncnn::activate_op_relie<float>>
                        (in_stack_00000060,in_stack_00000058);
  }
  else if (*(int *)(in_RDI + 0xb8) == 4) {
    local_4 = activate_op_inplace<ncnn::activate_op_ramp<float>>
                        (in_stack_00000040,in_stack_00000038);
  }
  else if (*(int *)(in_RDI + 0xb8) == 9) {
    local_4 = activate_op_inplace<ncnn::activate_op_loggy<float>>
                        (in_stack_00000040,in_stack_00000038);
  }
  else if (*(int *)(in_RDI + 0xb8) == 6) {
    local_4 = activate_op_inplace<ncnn::activate_op_plse<float>>
                        (in_stack_00000040,in_stack_00000038);
  }
  else if (*(int *)(in_RDI + 0xb8) == 10) {
    local_4 = activate_op_inplace<ncnn::activate_op_stair<float>>
                        (in_stack_00000040,in_stack_00000038);
  }
  else if (*(int *)(in_RDI + 0xb8) == 0xb) {
    local_4 = activate_op_inplace<ncnn::activate_op_hardtan<float>>
                        (in_stack_00000040,in_stack_00000038);
  }
  else if (*(int *)(in_RDI + 0xb8) == 0xc) {
    local_4 = activate_op_inplace<ncnn::activate_op_lhtan<float>>
                        (in_stack_00000040,in_stack_00000038);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int DarknetActivation::forward_inplace(Mat &bottom_top_blob,
                                       const Option &opt) const
{
  if (activate_type == Activate_LINEAR)
    return 0;
  if (activate_type == Activate_RELIE)
    return activate_op_inplace< activate_op_relie<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_RAMP)
    return activate_op_inplace< activate_op_ramp<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_LOGGY)
    return activate_op_inplace <activate_op_loggy<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_PLSE)
    return activate_op_inplace< activate_op_plse<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_STAIR)
    return activate_op_inplace< activate_op_stair<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_HARDTAN)
    return activate_op_inplace< activate_op_hardtan<float> >(bottom_top_blob, opt);
  if (activate_type == Activate_LHTAN)
    return activate_op_inplace< activate_op_lhtan<float> >(bottom_top_blob, opt);

  return 0;
}